

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O1

unsigned_long
duckdb::Chimp128Decompression<unsigned_long>::DecompressValue
          (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
          UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint uVar7;
  unsigned_long uVar8;
  InternalException *this;
  sbyte sVar9;
  uint uVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint8_t uVar13;
  ulong uVar14;
  uint uVar15;
  undefined7 in_register_00000039;
  ulong uVar16;
  byte bVar17;
  string local_50;
  
  uVar14 = CONCAT71(in_register_00000039,flag) & 0xffffffff;
  switch(uVar14) {
  case 0:
    uVar15 = (state->input).index;
    uVar10 = uVar15 & 7;
    puVar5 = (state->input).input;
    bVar6 = puVar5[uVar15 >> 3];
    bVar17 = (&DAT_0137f907)[uVar10];
    bVar1 = puVar5[((ulong)(uVar15 >> 3) + 1) - (ulong)((ulong)uVar10 == 0)];
    (state->input).index = uVar15 + 7;
    uVar8 = (state->ring_buffer).buffer
            [(uint)(byte)((bVar17 & bVar1) >> (1U - (char)uVar15 & 7)) |
             ((uint)bVar6 << (sbyte)uVar10) >> 1 & 0x7f];
    goto LAB_005655b2;
  case 1:
    uVar15 = *unpacked_index;
    *unpacked_index = uVar15 + 1;
    uVar13 = unpacked_data[uVar15].leading_zero;
    state->leading_zeros = uVar13;
    bVar17 = 0x40 - (uVar13 + unpacked_data[uVar15].significant_bits);
    state->trailing_zeros = bVar17;
    bVar6 = unpacked_data[uVar15].significant_bits;
    uVar14 = (ulong)(bVar6 >> 3);
    if (bVar6 < 8) {
      uVar12 = 0;
    }
    else {
      puVar5 = (state->input).input;
      uVar10 = (state->input).index;
      uVar16 = 0;
      uVar12 = 0;
      do {
        uVar12 = uVar12 << 8 |
                 (ulong)(((uint)CONCAT11(puVar5[uVar16 + (uVar10 >> 3)],
                                         puVar5[uVar16 + (ulong)(uVar10 >> 3) + 1] &
                                         (&DAT_0137f908)[uVar10 & 7]) << ((byte)uVar10 & 7)) >> 8 &
                        0xff);
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
    }
    uVar7 = bVar6 & 7;
    sVar9 = (sbyte)uVar7;
    uVar10 = (state->input).index;
    puVar5 = (state->input).input;
    bVar1 = puVar5[uVar14 + (uVar10 >> 3)];
    bVar2 = (&BitReader::MASKS)[uVar7];
    bVar3 = (&BitReader::REMAINDER_MASKS)[(byte)(((byte)uVar10 & 7) + sVar9)];
    bVar4 = puVar5[(uVar14 + (uVar10 >> 3) + 1) - (ulong)((uVar10 & 7) + uVar7 < 8)];
    (state->input).index = uVar10 + bVar6;
    uVar8 = ((ulong)((uint)(byte)((bVar3 & bVar4) >> (-(bVar6 + (byte)uVar10) & 7)) |
                    ((uint)bVar2 & (uint)bVar1 << (sbyte)(uVar10 & 7)) >> (8U - sVar9 & 0x1f)) |
            uVar12 << sVar9) << (bVar17 & 0x3f) ^
            (state->ring_buffer).buffer[unpacked_data[uVar15].index];
    goto LAB_005655b2;
  case 2:
    uVar13 = state->leading_zeros;
    bVar6 = 0x40 - uVar13;
    uVar15 = (uint)bVar6;
    uVar14 = (ulong)(bVar6 >> 3);
    if (bVar6 < 8) {
LAB_00565392:
      uVar16 = 0;
    }
    else {
      puVar5 = (state->input).input;
      uVar10 = (state->input).index;
      uVar12 = 0;
      uVar16 = 0;
      do {
        uVar16 = uVar16 << 8 |
                 (ulong)(((uint)CONCAT11(puVar5[uVar12 + (uVar10 >> 3)],
                                         puVar5[uVar12 + (ulong)(uVar10 >> 3) + 1] &
                                         (&DAT_0137f908)[uVar10 & 7]) << ((byte)uVar10 & 7)) >> 8 &
                        0xff);
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    break;
  case 3:
    uVar15 = *leading_zero_index;
    *leading_zero_index = uVar15 + 1;
    uVar13 = leading_zeros[uVar15];
    state->leading_zeros = uVar13;
    bVar6 = 0x40 - uVar13;
    uVar15 = (uint)bVar6;
    uVar14 = (ulong)(bVar6 >> 3);
    if (bVar6 < 8) goto LAB_00565392;
    puVar5 = (state->input).input;
    uVar10 = (state->input).index;
    uVar12 = 0;
    uVar16 = 0;
    do {
      uVar16 = uVar16 << 8 |
               (ulong)(((uint)CONCAT11(puVar5[uVar12 + (uVar10 >> 3)],
                                       puVar5[uVar12 + (ulong)(uVar10 >> 3) + 1] &
                                       (&DAT_0137f908)[uVar10 & 7]) << ((byte)uVar10 & 7)) >> 8 &
                      0xff);
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Chimp compression flag with value %d not recognized","");
    InternalException::InternalException<duckdb::ChimpConstants::Flags>
              (this,&local_50,(Flags)uVar14);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar7 = uVar15 & 7;
  sVar9 = (sbyte)uVar7;
  uVar10 = (state->input).index;
  puVar5 = (state->input).input;
  bVar6 = puVar5[uVar14 + (uVar10 >> 3)];
  bVar17 = (&BitReader::MASKS)[uVar7];
  bVar1 = (&BitReader::REMAINDER_MASKS)[(byte)(((byte)uVar10 & 7) + sVar9)];
  bVar2 = puVar5[(uVar14 + (uVar10 >> 3) + 1) - (ulong)((uVar10 & 7) + uVar7 < 8)];
  (state->input).index = uVar10 + uVar15;
  uVar8 = ((ulong)((uint)(byte)((bVar1 & bVar2) >> (uVar13 - (byte)uVar10 & 7)) |
                  ((uint)bVar17 & (uint)bVar6 << (sbyte)(uVar10 & 7)) >> (8U - sVar9 & 0x1f)) |
          uVar16 << sVar9) ^ state->reference_value;
LAB_005655b2:
  state->reference_value = uVar8;
  uVar11 = (state->ring_buffer).index + 1;
  (state->ring_buffer).index = uVar11;
  (state->ring_buffer).buffer[(uint)uVar11 & 0x7f] = uVar8;
  return uVar8;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}